

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O1

int coda_cdf_reopen(coda_product **product)

{
  coda_product *product_00;
  ushort uVar1;
  ushort uVar2;
  undefined1 uVar3;
  int iVar4;
  coda_cdf_product *product_file;
  char *pcVar5;
  coda_type_record *definition;
  coda_mem_record *pcVar6;
  uint32_t magic [2];
  undefined4 local_30;
  undefined4 local_2c;
  
  product_file = (coda_cdf_product *)malloc(0x90);
  if (product_file == (coda_cdf_product *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x90,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                   ,0x5d8);
    coda_close(*product);
    return -1;
  }
  product_file->filename = (char *)0x0;
  product_00 = *product;
  product_file->file_size = product_00->file_size;
  product_file->format = coda_format_cdf;
  product_file->root_type = (coda_mem_record *)0x0;
  product_file->product_definition = (coda_product_definition *)0x0;
  product_file->product_variable_size = (long *)0x0;
  product_file->product_variable = (int64_t **)0x0;
  product_file->mem_size = 0;
  product_file->mem_ptr = (uint8_t *)0x0;
  product_file->raw_product = product_00;
  pcVar5 = strdup(product_00->filename);
  product_file->filename = pcVar5;
  if (pcVar5 == (char *)0x0) {
    coda_set_error(-1,"out of memory (could not duplicate filename string) (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                   ,0x5ec);
    coda_cdf_close((coda_product *)product_file);
    return -1;
  }
  iVar4 = read_bytes(product_00,0,8,&local_30);
  if (-1 < iVar4) {
    uVar3 = (undefined1)local_30;
    uVar1 = local_30._1_2_ << 8;
    uVar2 = local_30._1_2_ >> 8;
    local_30 = CONCAT13(uVar3,CONCAT21(uVar1 | uVar2,local_30._3_1_));
    local_2c = CONCAT22((ushort)local_2c << 8 | (ushort)local_2c >> 8,
                        local_2c._2_2_ << 8 | local_2c._2_2_ >> 8);
    if ((local_30 == 0xffff) || (local_30 == -0x320d9ffe)) {
      pcVar5 = "CDF format version older than 3.0 is not supported";
    }
    else {
      if (local_2c != -0x3333ffff) {
        if ((local_30 != -0x320cffff) || (local_2c != 0xffff)) {
          __assert_fail("magic[0] == 0xCDF30001 && magic[1] == 0x0000FFFF",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                        ,0x607,"int coda_cdf_reopen(coda_product **)");
        }
        definition = coda_type_record_new(coda_format_cdf);
        if (definition != (coda_type_record *)0x0) {
          pcVar6 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
          product_file->root_type = pcVar6;
          if (pcVar6 == (coda_mem_record *)0x0) {
            coda_cdf_close((coda_product *)product_file);
            coda_type_release((coda_type *)definition);
            return -1;
          }
          coda_type_release((coda_type *)definition);
          iVar4 = read_file(product_file);
          if (iVar4 == 0) {
            *product = (coda_product *)product_file;
            return 0;
          }
        }
        goto LAB_00157564;
      }
      pcVar5 = "full file compression not supported for CDF files";
    }
    coda_set_error(-200,pcVar5);
  }
LAB_00157564:
  coda_cdf_close((coda_product *)product_file);
  return -1;
}

Assistant:

int coda_cdf_reopen(coda_product **product)
{
    coda_cdf_product *product_file;
    coda_type_record *root_definition;
    uint32_t magic[2];

    product_file = (coda_cdf_product *)malloc(sizeof(coda_cdf_product));
    if (product_file == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       sizeof(coda_cdf_product), __FILE__, __LINE__);
        coda_close(*product);
        return -1;
    }
    product_file->filename = NULL;
    product_file->file_size = (*product)->file_size;
    product_file->format = coda_format_cdf;
    product_file->root_type = NULL;
    product_file->product_definition = NULL;
    product_file->product_variable_size = NULL;
    product_file->product_variable = NULL;
    product_file->mem_size = 0;
    product_file->mem_ptr = NULL;

    product_file->raw_product = *product;

    product_file->filename = strdup((*product)->filename);
    if (product_file->filename == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate filename string) (%s:%u)",
                       __FILE__, __LINE__);
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }

    /* magic */
    if (read_bytes(product_file->raw_product, 0, 8, magic) < 0)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_uint32(&magic[0]);
    swap_uint32(&magic[1]);
#endif
    if (magic[0] == 0x0000FFFF || magic[0] == 0xCDF26002)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF format version older than 3.0 is not supported");
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    if (magic[1] == 0xCCCC0001)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "full file compression not supported for CDF files");
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    assert(magic[0] == 0xCDF30001 && magic[1] == 0x0000FFFF);

    /* create root type */
    root_definition = coda_type_record_new(coda_format_cdf);
    if (root_definition == NULL)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    product_file->root_type = coda_mem_record_new(root_definition, NULL);
    if (product_file->root_type == NULL)
    {
        coda_cdf_close((coda_product *)product_file);
        coda_type_release((coda_type *)root_definition);
        return -1;
    }
    coda_type_release((coda_type *)root_definition);

    if (read_file(product_file) != 0)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }

    *product = (coda_product *)product_file;

    return 0;
}